

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::writeBasis(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,ostream *os,NameSet *rowNames,NameSet *colNames,bool cpxFormat)

{
  Status SVar1;
  uint uVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  Status *pSVar3;
  Item *pIVar4;
  Type TVar5;
  ostream *poVar6;
  SPxRowId SVar7;
  long lVar8;
  int col;
  long lVar9;
  char *pcVar10;
  uint i;
  uint uVar11;
  char buf [255];
  
  *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
       *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) | 0x20;
  std::operator<<(os,"NAME  soplex.bas\n");
  if (this->thestatus == NO_PROBLEM) {
    poVar6 = std::operator<<(os,"ENDATA");
    std::endl<char,std::char_traits<char>>(poVar6);
    return;
  }
  lVar9 = 0;
  uVar11 = 0;
  do {
    this_00 = this->theLP;
    if ((this_00->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum <= lVar9) {
      poVar6 = std::operator<<(os,"ENDATA");
      std::endl<char,std::char_traits<char>>(poVar6);
      return;
    }
    SVar1 = (this->thedesc).colstat.data[lVar9];
    if (SVar1 < D_FREE) {
      if (SVar1 == P_ON_UPPER) {
        poVar6 = std::operator<<(os," UL ");
        pcVar10 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                            (&this->theLP->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(int)lVar9,colNames,buf);
        poVar6 = std::operator<<(poVar6,pcVar10);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
    }
    else {
      uVar2 = (this_00->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      pSVar3 = (this->thedesc).rowstat.data;
      lVar8 = (long)(int)uVar11;
      i = uVar2;
      if ((int)uVar2 < (int)uVar11) {
        i = uVar11;
      }
      for (; lVar8 < (int)uVar2; lVar8 = lVar8 + 1) {
        if (pSVar3[lVar8] < ~P_FREE) {
          i = (uint)lVar8;
          break;
        }
      }
      if (pSVar3[(int)i] == P_ON_UPPER) {
        pcVar10 = " XU ";
        if (cpxFormat) {
          TVar5 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::type((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)this_00,i);
          pcVar10 = " XU ";
          if (TVar5 != RANGE) goto LAB_00228bfc;
        }
      }
      else {
LAB_00228bfc:
        pcVar10 = " XL ";
      }
      std::operator<<(os,pcVar10);
      *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 8;
      pcVar10 = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&this->theLP->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,(int)lVar9,colNames,buf);
      std::operator<<(os,pcVar10);
      poVar6 = std::operator<<(os,"       ");
      if (rowNames == (NameSet *)0x0) {
LAB_00228c78:
        pcVar10 = buf;
        spxSnprintf(pcVar10,0x10,"C%d",(ulong)i);
      }
      else {
        SVar7 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::rId(&this->theLP->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ,i);
        pIVar4 = (rowNames->set).theitem;
        if (pIVar4[(long)SVar7.super_DataKey >> 0x20].info < 0) goto LAB_00228c78;
        pcVar10 = rowNames->mem + pIVar4[(long)SVar7.super_DataKey >> 0x20].data;
      }
      poVar6 = std::operator<<(poVar6,pcVar10);
      std::endl<char,std::char_traits<char>>(poVar6);
      uVar11 = i + 1;
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void SPxBasisBase<R>::writeBasis(
   std::ostream&  os,
   const NameSet* rowNames,
   const NameSet* colNames,
   const bool cpxFormat
) const
{
   assert(theLP != nullptr);

   os.setf(std::ios::left);
   os << "NAME  soplex.bas\n";

   /* do not write basis if there is none */
   if(status() == NO_PROBLEM)
   {
      os << "ENDATA" << std::endl;
      return;
   }

   /* start writing */
   char buf[255];
   int row = 0;

   for(int col = 0; col < theLP->nCols(); col++)
   {
      if(thedesc.colStatus(col) > 0)
      {
         /* Find non basic row */
         for(; row < theLP->nRows(); row++)
         {
            if(thedesc.rowStatus(row) < 0)
               break;
         }

         assert(row != theLP->nRows());

         if(thedesc.rowStatus(row) == Desc::P_ON_UPPER && (!cpxFormat
               || theLP->LPRowSetBase<R>::type(row) == LPRowBase<R>::RANGE))
            os << " XU ";
         else
            os << " XL ";

         os << std::setw(8) << getColName(theLP, col, colNames, buf);

         /* break in two parts since buf is reused */
         os << "       "
            << getRowName(theLP, row, rowNames, buf)
            << std::endl;

         row++;
      }
      else
      {
         if(thedesc.colStatus(col) == Desc::P_ON_UPPER)
         {
            os << " UL "
               << getColName(theLP, col, colNames, buf)
               << std::endl;
         }
         else
         {
            /* Default is all non-basic variables on lower bound (if finite) or at zero (if free).
             * nothing to do in this case.
             */
            assert(thedesc.colStatus(col) == Desc::P_ON_LOWER
                   || thedesc.colStatus(col) == Desc::P_FIXED
                   || thedesc.colStatus(col) == Desc::P_FREE);
            assert(thedesc.colStatus(col) == Desc::P_FREE || theLP->lower(col) > R(-infinity));
            assert(thedesc.colStatus(col) != Desc::P_FREE || theLP->lower(col) <= 0);
         }
      }
   }

#ifndef NDEBUG
   SPX_DEBUG(thedesc.dump());

   // Check that we covered all nonbasic rows - the remaining should be basic.
   for(; row < theLP->nRows(); row++)
   {
      if(thedesc.rowStatus(row) < 0)
         break;
   }

   assert(row == theLP->nRows());

#endif // NDEBUG

   os << "ENDATA" << std::endl;
}